

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O3

void Ssw_CheckConstraints(Ssw_Man_t *p)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  Ssw_Man_t *pSVar9;
  long lVar10;
  
  uVar7 = p->pFrames->nObjs[3] - p->pAig->nRegs;
  if ((uVar7 & 1) != 0) {
    __assert_fail("(nConstrPairs & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSweep.c"
                  ,0x5a,"void Ssw_CheckConstraints(Ssw_Man_t *)");
  }
  if ((int)uVar7 < 1) {
    uVar8 = 0;
    pSVar9 = p;
  }
  else {
    lVar10 = 0;
    uVar8 = 0;
    do {
      pVVar2 = p->pFrames->vCos;
      uVar1 = pVVar2->nSize;
      if (((int)uVar1 <= lVar10) || ((ulong)uVar1 <= lVar10 + 1U)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      ppvVar3 = pVVar2->pArray;
      pvVar4 = ppvVar3[lVar10];
      pvVar5 = ppvVar3[lVar10 + 1];
      pSVar9 = p;
      iVar6 = Ssw_NodesAreEquiv(p,(Aig_Obj_t *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe),
                                (Aig_Obj_t *)(*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe));
      if (iVar6 != 1) {
        pSVar9 = p;
        Ssw_NodesAreConstrained
                  (p,*(Aig_Obj_t **)((long)pvVar4 + 8),*(Aig_Obj_t **)((long)pvVar5 + 8));
        uVar8 = uVar8 + 1;
      }
      lVar10 = lVar10 + 2;
    } while ((int)lVar10 < (int)uVar7);
  }
  Abc_Print((int)pSVar9,"Total constraints = %d. Added constraints = %d.\n",
            (ulong)(uint)((int)uVar7 >> 1),(ulong)uVar8);
  return;
}

Assistant:

void Ssw_CheckConstraints( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObj2;
    int nConstrPairs, i;
    int Counter = 0;
    nConstrPairs = Aig_ManCoNum(p->pFrames)-Aig_ManRegNum(p->pAig);
    assert( (nConstrPairs & 1) == 0 );
    for ( i = 0; i < nConstrPairs; i += 2 )
    {
        pObj  = Aig_ManCo( p->pFrames, i   );
        pObj2 = Aig_ManCo( p->pFrames, i+1 );
        if ( Ssw_NodesAreEquiv( p, Aig_ObjFanin0(pObj), Aig_ObjFanin0(pObj2) ) != 1 )
        {
            Ssw_NodesAreConstrained( p, Aig_ObjChild0(pObj), Aig_ObjChild0(pObj2) );
            Counter++;
        }
    }
    Abc_Print( 1, "Total constraints = %d. Added constraints = %d.\n", nConstrPairs/2, Counter );
}